

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

int Curl_closesocket(connectdata *conn,curl_socket_t sock)

{
  int iVar1;
  
  if (conn != (connectdata *)0x0) {
    if (conn->fclosesocket != (curl_closesocket_callback)0x0) {
      if ((conn->sock[1] != sock) || (conn->sock_accepted[1] != true)) {
        Curl_multi_closed(conn,sock);
        iVar1 = (*conn->fclosesocket)(conn->closesocket_client,sock);
        return iVar1;
      }
      conn->sock_accepted[1] = false;
    }
    Curl_multi_closed(conn,sock);
  }
  close(sock);
  return 0;
}

Assistant:

int Curl_closesocket(struct connectdata *conn,
                      curl_socket_t sock)
{
  if(conn && conn->fclosesocket) {
    if((sock == conn->sock[SECONDARYSOCKET]) &&
       conn->sock_accepted[SECONDARYSOCKET])
      /* if this socket matches the second socket, and that was created with
         accept, then we MUST NOT call the callback but clear the accepted
         status */
      conn->sock_accepted[SECONDARYSOCKET] = FALSE;
    else {
      Curl_multi_closed(conn, sock);
      return conn->fclosesocket(conn->closesocket_client, sock);
    }
  }

  if(conn)
    /* tell the multi-socket code about this */
    Curl_multi_closed(conn, sock);

  sclose(sock);

  return 0;
}